

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

int packet_authagent_open
              (LIBSSH2_SESSION *session,uchar *data,size_t datalen,
              packet_authagent_state_t *authagent_state)

{
  int iVar1;
  uint32_t uVar2;
  uchar *puVar3;
  size_t offset;
  string_buf buf;
  LIBSSH2_CHANNEL *pLStack_50;
  int rc;
  LIBSSH2_CHANNEL *channel;
  uchar *p;
  size_t packet_len;
  packet_authagent_state_t *ppStack_30;
  int failure_code;
  packet_authagent_state_t *authagent_state_local;
  size_t datalen_local;
  uchar *data_local;
  LIBSSH2_SESSION *session_local;
  
  packet_len._4_4_ = 2;
  p = (uchar *)0x28;
  pLStack_50 = authagent_state->channel;
  buf.data = data + 0x1b;
  offset = (size_t)data;
  buf.dataptr = (uchar *)datalen;
  ppStack_30 = authagent_state;
  authagent_state_local = (packet_authagent_state_t *)datalen;
  datalen_local = (size_t)data;
  data_local = (uchar *)session;
  if (datalen < 0x1b) {
    iVar1 = _libssh2_error(session,-0x29,"Unexpected packet size");
    return iVar1;
  }
  if (authagent_state->state == libssh2_NB_state_idle) {
    iVar1 = _libssh2_get_u32((string_buf *)&offset,&authagent_state->sender_channel);
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting channel"
                            );
      return iVar1;
    }
    iVar1 = _libssh2_get_u32((string_buf *)&offset,&ppStack_30->initial_window_size);
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,
                             "Data too short extracting window size");
      return iVar1;
    }
    iVar1 = _libssh2_get_u32((string_buf *)&offset,&ppStack_30->packet_size);
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting packet")
      ;
      return iVar1;
    }
    ppStack_30->state = libssh2_NB_state_allocated;
  }
  if (*(long *)(data_local + 0x48) == 0) {
    packet_len._4_4_ = 4;
    goto LAB_0012b153;
  }
  if (ppStack_30->state == libssh2_NB_state_allocated) {
    pLStack_50 = (LIBSSH2_CHANNEL *)(**(code **)(data_local + 8))(0x340);
    ppStack_30->channel = pLStack_50;
    if (pLStack_50 == (LIBSSH2_CHANNEL *)0x0) {
      _libssh2_error((LIBSSH2_SESSION *)data_local,-6,"allocate a channel for new connection");
      packet_len._4_4_ = 4;
      goto LAB_0012b153;
    }
    memset(pLStack_50,0,0x340);
    pLStack_50->session = (LIBSSH2_SESSION *)data_local;
    pLStack_50->channel_type_len = 10;
    puVar3 = (uchar *)(**(code **)(data_local + 8))(pLStack_50->channel_type_len + 1,data_local);
    pLStack_50->channel_type = puVar3;
    if (pLStack_50->channel_type == (uchar *)0x0) {
      _libssh2_error((LIBSSH2_SESSION *)data_local,-6,"allocate a channel for new connection");
      (**(code **)(data_local + 0x18))(pLStack_50,data_local);
      packet_len._4_4_ = 4;
      goto LAB_0012b153;
    }
    memcpy(pLStack_50->channel_type,"auth agent",pLStack_50->channel_type_len + 1);
    (pLStack_50->remote).id = ppStack_30->sender_channel;
    (pLStack_50->remote).window_size_initial = 0x200000;
    (pLStack_50->remote).window_size = 0x200000;
    (pLStack_50->remote).packet_size = 0x8000;
    uVar2 = _libssh2_channel_nextid((LIBSSH2_SESSION *)data_local);
    (pLStack_50->local).id = uVar2;
    (pLStack_50->local).window_size_initial = ppStack_30->initial_window_size;
    (pLStack_50->local).window_size = ppStack_30->initial_window_size;
    (pLStack_50->local).packet_size = ppStack_30->packet_size;
    channel = (LIBSSH2_CHANNEL *)(ppStack_30->packet + 1);
    ppStack_30->packet[0] = '[';
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->remote).id);
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->local).id);
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->remote).window_size_initial);
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->remote).packet_size);
    ppStack_30->state = libssh2_NB_state_created;
  }
  if (ppStack_30->state == libssh2_NB_state_created) {
    buf.len._4_4_ =
         _libssh2_transport_send
                   ((LIBSSH2_SESSION *)data_local,ppStack_30->packet,0x11,(uchar *)0x0,0);
    if (buf.len._4_4_ == -0x25) {
      return -0x25;
    }
    if (buf.len._4_4_ != 0) {
      ppStack_30->state = libssh2_NB_state_idle;
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-7,
                             "Unable to send channel open confirmation");
      return iVar1;
    }
    _libssh2_list_add((list_head *)(data_local + 0x230),&pLStack_50->node);
    data_local[0x8b58] = '\0';
    data_local[0x8b59] = '\0';
    data_local[0x8b5a] = '\0';
    data_local[0x8b5b] = '\0';
    data_local[0x8b5c] = '\0';
    data_local[0x8b5d] = '\0';
    data_local[0x8b5e] = '\0';
    data_local[0x8b5f] = '\0';
    data_local[0x11cb0] = '\0';
    data_local[0x11cb1] = '\0';
    data_local[0x11cb2] = '\0';
    data_local[0x11cb3] = '\0';
    (*pLStack_50->session->authagent)(pLStack_50->session,pLStack_50,&pLStack_50->session->abstract)
    ;
    ppStack_30->state = libssh2_NB_state_idle;
    return 0;
  }
LAB_0012b153:
  channel = (LIBSSH2_CHANNEL *)(ppStack_30->packet + 1);
  ppStack_30->packet[0] = '\\';
  _libssh2_store_u32((uchar **)&channel,ppStack_30->sender_channel);
  _libssh2_store_u32((uchar **)&channel,packet_len._4_4_);
  _libssh2_store_str((uchar **)&channel,"Auth Agent unavailable",0x16);
  _libssh2_htonu32((uchar *)channel,0);
  buf.len._4_4_ =
       _libssh2_transport_send
                 ((LIBSSH2_SESSION *)data_local,ppStack_30->packet,(size_t)p,(uchar *)0x0,0);
  if (buf.len._4_4_ == -0x25) {
    session_local._4_4_ = -0x25;
  }
  else if (buf.len._4_4_ == 0) {
    ppStack_30->state = libssh2_NB_state_idle;
    session_local._4_4_ = 0;
  }
  else {
    ppStack_30->state = libssh2_NB_state_idle;
    session_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_local,buf.len._4_4_,"Unable to send open failure");
  }
  return session_local._4_4_;
}

Assistant:

static inline int
packet_authagent_open(LIBSSH2_SESSION * session,
                      unsigned char *data, size_t datalen,
                      packet_authagent_state_t *authagent_state)
{
    int failure_code = SSH_OPEN_CONNECT_FAILED;
    /* 17 = packet_type(1) + channel(4) + reason(4) + descr(4) + lang(4) */
    size_t packet_len = 17 + strlen(X11FwdUnAvil);
    unsigned char *p;
    LIBSSH2_CHANNEL *channel = authagent_state->channel;
    int rc;
    struct string_buf buf;
    size_t offset = strlen("auth-agent@openssh.org") + 5;

    buf.data = data;
    buf.dataptr = buf.data;
    buf.len = datalen;

    buf.dataptr += offset;

    if(datalen < offset) {
        return _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                              "Unexpected packet size");
    }

    if(authagent_state->state == libssh2_NB_state_idle) {
        if(_libssh2_get_u32(&buf, &(authagent_state->sender_channel))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting channel");
        }
        if(_libssh2_get_u32(&buf, &(authagent_state->initial_window_size))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting window size");
        }
        if(_libssh2_get_u32(&buf, &(authagent_state->packet_size))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting packet");
        }

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Auth Agent Connection Received on channel %u",
                       authagent_state->sender_channel));

        authagent_state->state = libssh2_NB_state_allocated;
    }

    if(session->authagent) {
        if(authagent_state->state == libssh2_NB_state_allocated) {
            channel = LIBSSH2_ALLOC(session, sizeof(LIBSSH2_CHANNEL));
            authagent_state->channel = channel;

            if(!channel) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "allocate a channel for new connection");
                failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                goto authagent_exit;
            }
            memset(channel, 0, sizeof(LIBSSH2_CHANNEL));

            channel->session = session;
            channel->channel_type_len = strlen("auth agent");
            channel->channel_type = LIBSSH2_ALLOC(session,
                                                  channel->channel_type_len +
                                                  1);
            if(!channel->channel_type) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "allocate a channel for new connection");
                LIBSSH2_FREE(session, channel);
                failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                goto authagent_exit;
            }
            memcpy(channel->channel_type, "auth agent",
                   channel->channel_type_len + 1);

            channel->remote.id = authagent_state->sender_channel;
            channel->remote.window_size_initial =
                LIBSSH2_CHANNEL_WINDOW_DEFAULT;
            channel->remote.window_size = LIBSSH2_CHANNEL_WINDOW_DEFAULT;
            channel->remote.packet_size = LIBSSH2_CHANNEL_PACKET_DEFAULT;

            channel->local.id = _libssh2_channel_nextid(session);
            channel->local.window_size_initial =
                authagent_state->initial_window_size;
            channel->local.window_size = authagent_state->initial_window_size;
            channel->local.packet_size = authagent_state->packet_size;

            _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                           "Auth Agent Connection established: channel "
                           "%u/%u win %u/%u packet %u/%u",
                           channel->local.id, channel->remote.id,
                           channel->local.window_size,
                           channel->remote.window_size,
                           channel->local.packet_size,
                           channel->remote.packet_size));

            p = authagent_state->packet;
            *(p++) = SSH_MSG_CHANNEL_OPEN_CONFIRMATION;
            _libssh2_store_u32(&p, channel->remote.id);
            _libssh2_store_u32(&p, channel->local.id);
            _libssh2_store_u32(&p, channel->remote.window_size_initial);
            _libssh2_store_u32(&p, channel->remote.packet_size);

            authagent_state->state = libssh2_NB_state_created;
        }

        if(authagent_state->state == libssh2_NB_state_created) {
            rc = _libssh2_transport_send(session, authagent_state->packet, 17,
                                         NULL, 0);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                return rc;
            }
            else if(rc) {
                authagent_state->state = libssh2_NB_state_idle;
                return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                      "Unable to send channel open "
                                      "confirmation");
            }

            /* Link the channel into the session */
            _libssh2_list_add(&session->channels, &channel->node);

            /* mess with stuff so we don't keep reading the same packet
               over and over */
            session->packet.total_num = 0;
            session->fullpacket_state = libssh2_NB_state_idle;

            /* Pass control to the callback, they may turn right around and
               and free the channel, or actually use it */

            LIBSSH2_AUTHAGENT(channel);

            authagent_state->state = libssh2_NB_state_idle;
            return 0;
        }
    }
    else
        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;

    /* fall-through */
authagent_exit:
    p = authagent_state->packet;
    *(p++) = SSH_MSG_CHANNEL_OPEN_FAILURE;
    _libssh2_store_u32(&p, authagent_state->sender_channel);
    _libssh2_store_u32(&p, failure_code);
    _libssh2_store_str(&p, AuthAgentUnavail, strlen(AuthAgentUnavail));
    _libssh2_htonu32(p, 0);

    rc = _libssh2_transport_send(session, authagent_state->packet, packet_len,
                                 NULL, 0);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }
    else if(rc) {
        authagent_state->state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc, "Unable to send open failure");
    }
    authagent_state->state = libssh2_NB_state_idle;
    return 0;
}